

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMultiSphereShape.cpp
# Opt level: O2

void __thiscall
cbtMultiSphereShape::cbtMultiSphereShape
          (cbtMultiSphereShape *this,cbtVector3 *positions,cbtScalar *radi,int numSpheres)

{
  cbtScalar *pcVar1;
  undefined8 uVar2;
  long lVar3;
  cbtVector3 local_40;
  
  cbtConvexInternalAabbCachingShape::cbtConvexInternalAabbCachingShape
            (&this->super_cbtConvexInternalAabbCachingShape);
  (this->super_cbtConvexInternalAabbCachingShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape = (_func_int **)&PTR__cbtMultiSphereShape_01196bb0
  ;
  (this->m_localPositionArray).m_ownsMemory = true;
  (this->m_localPositionArray).m_data = (cbtVector3 *)0x0;
  (this->m_localPositionArray).m_size = 0;
  (this->m_localPositionArray).m_capacity = 0;
  (this->m_radiArray).m_ownsMemory = true;
  (this->m_radiArray).m_data = (float *)0x0;
  (this->m_radiArray).m_size = 0;
  (this->m_radiArray).m_capacity = 0;
  (this->super_cbtConvexInternalAabbCachingShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 9;
  cbtAlignedObjectArray<cbtVector3>::resize(&this->m_localPositionArray,numSpheres,&local_40);
  local_40.m_floats[0] = 0.0;
  cbtAlignedObjectArray<float>::resize(&this->m_radiArray,numSpheres,local_40.m_floats);
  for (lVar3 = 0; (ulong)(uint)(~(numSpheres >> 0x1f) & numSpheres) << 2 != lVar3; lVar3 = lVar3 + 4
      ) {
    uVar2 = *(undefined8 *)(positions->m_floats + lVar3 + 2);
    pcVar1 = ((this->m_localPositionArray).m_data)->m_floats + lVar3;
    *(undefined8 *)pcVar1 = *(undefined8 *)(positions->m_floats + lVar3);
    *(undefined8 *)(pcVar1 + 2) = uVar2;
    *(undefined4 *)((long)(this->m_radiArray).m_data + lVar3) = *(undefined4 *)((long)radi + lVar3);
  }
  cbtConvexInternalAabbCachingShape::recalcLocalAabb(&this->super_cbtConvexInternalAabbCachingShape)
  ;
  return;
}

Assistant:

cbtMultiSphereShape::cbtMultiSphereShape(const cbtVector3* positions, const cbtScalar* radi, int numSpheres)
	: cbtConvexInternalAabbCachingShape()
{
	m_shapeType = MULTI_SPHERE_SHAPE_PROXYTYPE;
	//cbtScalar startMargin = cbtScalar(BT_LARGE_FLOAT);

	m_localPositionArray.resize(numSpheres);
	m_radiArray.resize(numSpheres);
	for (int i = 0; i < numSpheres; i++)
	{
		m_localPositionArray[i] = positions[i];
		m_radiArray[i] = radi[i];
	}

	recalcLocalAabb();
}